

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZInstPrinter.c
# Opt level: O0

void printAddress(MCInst *MI,uint Base,int64_t Disp,uint Index,SStream *O)

{
  cs_detail *pcVar1;
  sysz_reg sVar2;
  char *pcVar3;
  uint8_t *puVar4;
  SStream *O_local;
  uint Index_local;
  int64_t Disp_local;
  uint Base_local;
  MCInst *MI_local;
  
  if (Disp < 0) {
    if (Disp < -9) {
      SStream_concat(O,"-0x%lx",-Disp);
    }
    else {
      SStream_concat(O,"-%lu",-Disp);
    }
  }
  else if (Disp < 10) {
    SStream_concat(O,"%lu",Disp);
  }
  else {
    SStream_concat(O,"0x%lx",Disp);
  }
  if (Base == 0) {
    if ((Index == 0) && (MI->csh->detail != CS_OPT_OFF)) {
      puVar4 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x16;
      puVar4[0] = '\x02';
      puVar4[1] = '\0';
      puVar4[2] = '\0';
      puVar4[3] = '\0';
      *(int64_t *)
       (MI->flat_insn->detail->groups +
       (ulong)(MI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x1e) = Disp;
      pcVar1 = MI->flat_insn->detail;
      (pcVar1->field_6).x86.opcode[0] = (pcVar1->field_6).x86.opcode[0] + '\x01';
    }
  }
  else {
    SStream_concat0(O,"(");
    if (Index != 0) {
      pcVar3 = getRegisterName(Index);
      SStream_concat(O,"%%%s, ",pcVar3);
    }
    pcVar3 = getRegisterName(Base);
    SStream_concat(O,"%%%s)",pcVar3);
    if (MI->csh->detail != CS_OPT_OFF) {
      puVar4 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x16;
      puVar4[0] = '\x03';
      puVar4[1] = '\0';
      puVar4[2] = '\0';
      puVar4[3] = '\0';
      sVar2 = SystemZ_map_register(Base);
      MI->flat_insn->detail->groups
      [(ulong)(MI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x1e] = (uint8_t)sVar2;
      sVar2 = SystemZ_map_register(Index);
      MI->flat_insn->detail->groups
      [(ulong)(MI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x1f] = (uint8_t)sVar2;
      *(int64_t *)
       (MI->flat_insn->detail->groups +
       (ulong)(MI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x2e) = Disp;
      pcVar1 = MI->flat_insn->detail;
      (pcVar1->field_6).x86.opcode[0] = (pcVar1->field_6).x86.opcode[0] + '\x01';
    }
  }
  return;
}

Assistant:

static void printAddress(MCInst *MI, unsigned Base, int64_t Disp, unsigned Index, SStream *O)
{
	if (Disp >= 0) {
		if (Disp > HEX_THRESHOLD)
			SStream_concat(O, "0x%"PRIx64, Disp);
		else
			SStream_concat(O, "%"PRIu64, Disp);
	} else {
		if (Disp < -HEX_THRESHOLD)
			SStream_concat(O, "-0x%"PRIx64, -Disp);
		else
			SStream_concat(O, "-%"PRIu64, -Disp);
	}

	if (Base) {
		SStream_concat0(O, "(");
		if (Index)
			SStream_concat(O, "%%%s, ", getRegisterName(Index));
		SStream_concat(O, "%%%s)", getRegisterName(Base));

		if (MI->csh->detail) {
			MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].type = SYSZ_OP_MEM;
			MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].mem.base = (uint8_t)SystemZ_map_register(Base);
			MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].mem.index = (uint8_t)SystemZ_map_register(Index);
			MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].mem.disp = Disp;
			MI->flat_insn->detail->sysz.op_count++;
		}
	} else if (!Index) {
		if (MI->csh->detail) {
			MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].type = SYSZ_OP_IMM;
			MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].imm = Disp;
			MI->flat_insn->detail->sysz.op_count++;
		}
	}
}